

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall
helics::apps::Recorder::captureForCurrentTime(Recorder *this,Time currentTime,int iteration)

{
  int iVar1;
  _Elt_pointer pIVar2;
  pointer pVVar3;
  Time TVar4;
  bool bVar5;
  mapped_type *pmVar6;
  string *psVar7;
  Endpoint *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar8;
  _Elt_pointer this_01;
  _Elt_pointer this_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  Time currentTime_local;
  int subId;
  _Map_pointer local_f8;
  _Elt_pointer local_f0;
  undefined1 local_e8 [24];
  _Alloc_hider _Stack_d0;
  pointer local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  MessageFederate *pMStack_b0;
  _Elt_pointer local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  undefined1 local_80 [8];
  string valstr;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  
  local_f8 = (_Map_pointer)CONCAT44(local_f8._4_4_,iteration);
  this_01 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar8 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_80 = (undefined1  [8])
             (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pIVar2 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_f0 = (_Elt_pointer)&this->subids;
  currentTime_local.internalTimeCode = currentTime.internalTimeCode;
  local_a8 = pIVar8;
  while (this_01 != pIVar2) {
    bVar5 = Input::isUpdated(this_01);
    if (bVar5) {
      Input::getValue_impl<std::__cxx11::string>(&val,this_01);
      local_e8._0_4_ = (this_01->super_Interface).handle.hid;
      pmVar6 = CLI::std::
               map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
               ::operator[]((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                             *)local_f0,(key_type *)local_e8);
      subId = *pmVar6;
      std::
      vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
      ::emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                ((vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
                  *)&this->points,&currentTime_local,&subId,&val);
      TVar4 = currentTime_local;
      if (0 < (int)local_f8) {
        (this->points).
        super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].iteration = (int16_t)local_f8;
      }
      if (this->verbose == true) {
        valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
        valstr._M_string_length = 0;
        valstr.field_2._M_local_buf[0] = '\0';
        if (val._M_string_length < 0x96) {
          if ((int)local_f8 < 1) {
            psVar7 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar4.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar4.internalTimeCode / 1000000000);
            local_e8._16_8_ = (psVar7->_M_dataplus)._M_p;
            _Stack_d0._M_p = (pointer)psVar7->_M_string_length;
            local_c8 = val._M_dataplus._M_p;
            aStack_c0._M_allocated_capacity = val._M_string_length;
            fmt_01.size_ = 0xdda;
            fmt_01.data_ = (char *)0xf;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_((string *)&mess,(v11 *)"[{}]value {}={}",fmt_01,args_01);
          }
          else {
            psVar7 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar4.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar4.internalTimeCode / 1000000000);
            local_e8._16_4_ = (int)local_f8;
            local_c8 = (psVar7->_M_dataplus)._M_p;
            aStack_c0._M_allocated_capacity = psVar7->_M_string_length;
            aStack_c0._8_8_ = val._M_dataplus._M_p;
            pMStack_b0 = (MessageFederate *)val._M_string_length;
            fmt.size_ = 0xdd1a;
            fmt.data_ = (char *)0x12;
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_((string *)&mess,(v11 *)"[{}:{}]value {}={}",fmt,args);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(&valstr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mess);
        }
        else {
          if ((int)local_f8 < 1) {
            psVar7 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar4.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar4.internalTimeCode / 1000000000);
            local_e8._16_8_ = (psVar7->_M_dataplus)._M_p;
            _Stack_d0._M_p = (pointer)psVar7->_M_string_length;
            local_c8 = (pointer)val._M_string_length;
            fmt_02.size_ = 0x4da;
            fmt_02.data_ = (char *)0x16;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&mess,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02);
          }
          else {
            psVar7 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar4.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar4.internalTimeCode / 1000000000);
            local_e8._16_4_ = (int)local_f8;
            local_c8 = (psVar7->_M_dataplus)._M_p;
            aStack_c0._M_allocated_capacity = psVar7->_M_string_length;
            aStack_c0._8_8_ = val._M_string_length;
            fmt_00.size_ = 0x4d1a;
            fmt_00.data_ = (char *)0x19;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&mess,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(&valstr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mess);
        }
        std::__cxx11::string::~string((string *)&mess);
        spdlog::info<std::__cxx11::string>(&valstr);
        std::__cxx11::string::~string((string *)&valstr);
      }
      pVVar3 = (this->vStat).
               super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = pVVar3[subId].cnt;
      if (iVar1 == 0) {
        (this->points).
        super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first = true;
      }
      pVVar3[subId].cnt = iVar1 + 1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&pVVar3[subId].lastVal,&val);
      (this->vStat).
      super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
      ._M_impl.super__Vector_impl_data._M_start[subId].time.internalTimeCode = -1000000000;
      std::__cxx11::string::~string((string *)&val);
      pIVar8 = local_a8;
    }
    this_01 = this_01 + 1;
    if (this_01 == pIVar8) {
      this_01 = *(_Map_pointer)((long)local_80 + 8);
      local_80 = (undefined1  [8])((long)local_80 + 8);
      pIVar8 = this_01 + 1;
      local_a8 = pIVar8;
    }
  }
  this_02 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_f0 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_f8 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  local_a8 = (_Elt_pointer)
             (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  while ((_Elt_pointer)this_02 != local_a8) {
    while (bVar5 = Endpoint::hasMessage(this_02), bVar5) {
      Endpoint::getMessage((Endpoint *)&mess);
      if (this->verbose == true) {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        val._M_string_length = 0;
        val.field_2._M_local_buf[0] = '\0';
        aStack_c0._8_8_ =
             *(ulong *)((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x50);
        if ((ulong)aStack_c0._8_8_ < (MessageFederate *)0x32) {
          local_e8._0_8_ =
               (double)(currentTime_local.internalTimeCode % 1000000000) * 1e-09 +
               (double)(currentTime_local.internalTimeCode / 1000000000);
          local_e8._16_8_ =
               *(undefined8 *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          _Stack_d0._M_p =
               *(pointer *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70);
          aStack_c0._M_allocated_capacity =
               *(size_type *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x78);
          fmt_03.size_ = 0xddda;
          fmt_03.data_ = (char *)0x1d;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_e8;
          pMStack_b0 = (MessageFederate *)aStack_c0._8_8_;
          aStack_c0._8_8_ =
               *(pointer *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60);
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from {} to {}::{}",fmt_03,args_03);
        }
        else {
          local_e8._0_8_ =
               (double)(currentTime_local.internalTimeCode % 1000000000) * 1e-09 +
               (double)(currentTime_local.internalTimeCode / 1000000000);
          local_e8._16_8_ =
               *(undefined8 *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          _Stack_d0._M_p =
               *(pointer *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70);
          aStack_c0._M_allocated_capacity =
               *(size_type *)
                ((long)mess._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x78);
          fmt_04.size_ = 0x4dda;
          fmt_04.data_ = (char *)0x23;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)local_e8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from {} to {}:: size {}",fmt_04,args_04);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&valstr)
        ;
        std::__cxx11::string::~string((string *)&valstr);
        spdlog::info<std::__cxx11::string>(&val);
        std::__cxx11::string::~string((string *)&val);
      }
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)&this->messages,&mess);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                (&mess);
    }
    this_02 = this_02 + 1;
    if (this_02 == local_f0) {
      this_02 = local_f8[1];
      local_f8 = local_f8 + 1;
      local_f0 = this_02 + 4;
    }
  }
  this_00 = (this->cloneEndpoint)._M_t.
            super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
            super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
            super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
  if (this_00 != (Endpoint *)0x0) {
    while (bVar5 = Endpoint::hasMessage(this_00), bVar5) {
      Endpoint::getMessage((Endpoint *)local_e8);
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)&this->messages,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_e8);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_e8);
      this_00 = (this->cloneEndpoint)._M_t.
                super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t
                .super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
                super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    }
  }
  return;
}

Assistant:

void Recorder::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subId = subids[sub.getHandle()];
            points.emplace_back(currentTime, subId, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (vStat[subId].cnt == 0) {
                points.back().first = true;
            }
            ++vStat[subId].cnt;
            vStat[subId].lastVal = val;
            vStat[subId].time = -1.0;
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (verbose) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                spdlog::info(messstr);
            }
            messages.push_back(std::move(mess));
        }
    }
    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}